

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O1

void decode_string(uint8_t *dst,uint8_t *src)

{
  ulong uVar1;
  long lVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  long lVar5;
  
  uVar1 = 0;
  if (*src != '\0') {
    lVar2 = 0;
    do {
      uVar4 = bca[src[lVar2]][0];
      if (uVar4 != '\0') {
        puVar3 = dst + (int)uVar1;
        lVar5 = 0x1150f1;
        do {
          *puVar3 = uVar4;
          uVar4 = *(uint8_t *)(lVar5 + (ulong)src[lVar2] * 3);
          puVar3 = puVar3 + 1;
          uVar1 = (ulong)((int)uVar1 + 1);
          lVar5 = lVar5 + 1;
        } while (uVar4 != '\0');
      }
      lVar5 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (src[lVar5] != '\0');
    uVar1 = (ulong)(int)uVar1;
  }
  dst[uVar1] = '\0';
  return;
}

Assistant:

void decode_string(uint8_t dst[], uint8_t src[]) {
    int j = 0;
    for (int i = 0; src[i]; i++) {
        for (int k = 0; bca[src[i]][k]; ++k) {
            dst[j++] = bca[src[i]][k];
        }
    }
    dst[j] = '\0'; //terminator
}